

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O2

QRgbaFloat32 *
convertCMYKToRGBA32F
          (QRgbaFloat32 *buffer,uint *src,int count,QList<unsigned_int> *param_4,
          QDitherInfo *param_5)

{
  QRgb rgb;
  ulong uVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  QColor QVar3;
  QRgbaFloat<float> QVar4;
  QCmyk32 local_4c;
  QColor local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = 0;
  uVar2 = (ulong)(uint)count;
  if (count < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 * 4 != uVar1; uVar1 = uVar1 + 4) {
    local_4c.m_cmyk = *(uint *)((long)src + uVar1);
    QVar3 = QCmyk32::toColor(&local_4c);
    local_48._0_8_ = QVar3._0_8_;
    local_48.ct._4_4_ = QVar3.ct._4_4_;
    local_48.ct.argb.pad = QVar3.ct._8_2_;
    rgb = QColor::rgba(&local_48);
    QVar4 = QRgbaFloat<float>::fromArgb32(rgb);
    *(QRgbaFloat<float> *)(&buffer->r + uVar1) = QVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return buffer;
  }
  __stack_chk_fail();
}

Assistant:

static const QRgbaFloat32 * QT_FASTCALL convertCMYKToRGBA32F(QRgbaFloat32 *buffer, const uint *src, int count,
                                                             const QList<QRgb> *, QDitherInfo *)
{
    for (int i = 0; i < count; ++i)
        buffer[i] = QRgbaFloat32::fromArgb32(QCmyk32::fromCmyk32(src[i]).toColor().rgba());

    return buffer;
}